

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice.cpp
# Opt level: O2

bool __thiscall stream::slice_reader::open_file(slice_reader *this,path_type *file)

{
  ifstream *is;
  bool bVar1;
  uint uVar2;
  logger *plVar3;
  long lVar4;
  long *plVar5;
  ostream *poVar6;
  basic_ostream<char,_std::char_traits<char>_> *pbVar7;
  slice_error *psVar8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> bStack_1d8;
  char magic [8];
  ostringstream oss;
  ostringstream local_1a8 [376];
  
  bVar1 = boost::filesystem::exists(file);
  if (bVar1) {
    if (logger::quiet == false) {
      _oss = Info;
      std::__cxx11::ostringstream::ostringstream(local_1a8);
      std::operator<<((ostream *)local_1a8,"Opening \"");
      plVar3 = logger::operator<<((logger *)&oss,(shell_command *)&color::cyan);
      std::operator<<((ostream *)&plVar3->buffer,(string *)file);
      plVar3 = logger::operator<<(plVar3,(shell_command *)&color::reset);
      std::operator<<((ostream *)&plVar3->buffer,'\"');
      logger::~logger((logger *)&oss);
    }
    is = &this->ifs;
    std::ifstream::close();
    bVar1 = false;
    std::ios::clear((int)(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3]
                    + (int)is);
    boost::filesystem::basic_ifstream<char,_std::char_traits<char>_>::open(is,(char *)file,0xe);
    if (((byte)((this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3] + 0x20)
               [(long)&(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                       super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream] & 5)
        == 0) {
      lVar4 = std::istream::tellg();
      std::istream::seekg(is,0,0);
      plVar5 = (long *)std::istream::read((char *)is,(long)magic);
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) {
        std::ifstream::close();
        psVar8 = (slice_error *)__cxa_allocate_exception(0x20);
        std::operator+(&bStack_1d8,"could not read slice magic number in \"",&file->m_pathname);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                       &bStack_1d8,"\"");
        slice_error::slice_error(psVar8,(string *)&oss);
        __cxa_throw(psVar8,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      uVar2 = util::load<int,util::little_endian>((istream *)is);
      this->slice_size = uVar2;
      if (((byte)((this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                  super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream[-3] + 0x20)
                 [(long)&(this->ifs).super_basic_ifstream<char,_std::char_traits<char>_>.
                         super_basic_istream<char,_std::char_traits<char>_>._vptr_basic_istream] & 5
          ) != 0) {
        std::ifstream::close();
        psVar8 = (slice_error *)__cxa_allocate_exception(0x20);
        std::operator+(&bStack_1d8,"could not read slice size in \"",&file->m_pathname);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&oss,
                       &bStack_1d8,"\"");
        slice_error::slice_error(psVar8,(string *)&oss);
        __cxa_throw(psVar8,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      if (lVar4 < (long)(ulong)uVar2) {
        std::ifstream::close();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar6 = std::operator<<((ostream *)&oss,"bad slice size in ");
        pbVar7 = boost::filesystem::operator<<(poVar6,file);
        poVar6 = std::operator<<(pbVar7,": ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," > ");
        std::ostream::_M_insert<long>((long)poVar6);
        psVar8 = (slice_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        slice_error::slice_error(psVar8,&bStack_1d8);
        __cxa_throw(psVar8,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      lVar4 = std::istream::tellg();
      if ((long)(ulong)uVar2 < lVar4) {
        std::ifstream::close();
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&oss);
        poVar6 = std::operator<<((ostream *)&oss,"bad slice size in ");
        pbVar7 = boost::filesystem::operator<<(poVar6,file);
        poVar6 = std::operator<<(pbVar7,": ");
        poVar6 = std::ostream::_M_insert<unsigned_long>((ulong)poVar6);
        poVar6 = std::operator<<(poVar6," < ");
        std::istream::tellg();
        std::ostream::_M_insert<long>((long)poVar6);
        psVar8 = (slice_error *)__cxa_allocate_exception(0x20);
        std::__cxx11::stringbuf::str();
        slice_error::slice_error(psVar8,&bStack_1d8);
        __cxa_throw(psVar8,&slice_error::typeinfo,std::ios_base::failure[abi:cxx11]::~failure);
      }
      bVar1 = true;
    }
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool slice_reader::open_file(const path_type & file) {
	
	if(!boost::filesystem::exists(file)) {
		return false;
	}
	
	log_info << "Opening \"" << color::cyan << file.string() << color::reset << '"';
	
	ifs.close();
	ifs.clear();
	
	ifs.open(file, std::ios_base::in | std::ios_base::binary | std::ios_base::ate);
	if(ifs.fail()) {
		return false;
	}
	
	std::streampos file_size = ifs.tellg();
	ifs.seekg(0);
	
	char magic[8];
	if(ifs.read(magic, 8).fail()) {
		ifs.close();
		throw slice_error("could not read slice magic number in \"" + file.string() + "\"");
	}
	bool found = false;
	for(size_t i = 0; boost::size(slice_ids); i++) {
		if(!std::memcmp(magic, slice_ids[i], 8)) {
			found = true;
			break;
		}
	}
	if(!found) {
		ifs.close();
		throw slice_error("bad slice magic number in \"" + file.string() + "\"");
	}
	
	slice_size = util::load<boost::uint32_t>(ifs);
	if(ifs.fail()) {
		ifs.close();
		throw slice_error("could not read slice size in \"" + file.string() + "\"");
	} else if(std::streampos(slice_size) > file_size) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " > " << file_size;
		throw slice_error(oss.str());
	} else if(std::streampos(slice_size) < ifs.tellg()) {
		ifs.close();
		std::ostringstream oss;
		oss << "bad slice size in " << file << ": " << slice_size << " < " << ifs.tellg();
		throw slice_error(oss.str());
	}
	
	return true;
}